

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O2

bool __thiscall
USDFParser::ParseCostRequireExclude(USDFParser *this,FStrifeDialogueReply *response,FName *type)

{
  int iVar1;
  bool bVar2;
  PClassActor *p;
  long lStack_50;
  FName key;
  FStrifeDialogueItemCheck check;
  
  check.Item = (PClassInventory *)0x0;
  check.Amount = -1;
  while (bVar2 = FScanner::CheckToken((FScanner *)this,0x7d), !bVar2) {
    UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
    if (key.Index == 0x1de) {
      check.Amount = UDMFParserBase::CheckInt
                               (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1de].Text);
    }
    else if (key.Index == 0x29) {
      p = CheckActorType(this,FName::NameData.NameArray[0x29].Text);
      check.Item = dyn_cast<PClassInventory>((DObject *)p);
    }
  }
  iVar1 = type->Index;
  if (iVar1 == 0x1e7) {
    lStack_50 = 0x28;
  }
  else if (iVar1 == 0x1f2) {
    lStack_50 = 0x48;
  }
  else {
    if (iVar1 != 0x1f1) {
      return true;
    }
    lStack_50 = 0x38;
  }
  TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Push
            ((TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck> *)
             ((long)response->Args + lStack_50 + -0x14),&check);
  return true;
}

Assistant:

bool ParseCostRequireExclude(FStrifeDialogueReply *response, FName type)
	{
		FStrifeDialogueItemCheck check;
		check.Item = NULL;
		check.Amount = -1;

		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Item:
				check.Item = dyn_cast<PClassInventory>(CheckActorType(key));
				break;

			case NAME_Amount:
				check.Amount = CheckInt(key);
				break;
			}
		}

		switch (type)
		{
		case NAME_Cost:		response->ItemCheck.Push(check);	break;
		case NAME_Require:	response->ItemCheckRequire.Push(check); break;
		case NAME_Exclude:	response->ItemCheckExclude.Push(check); break;
		}
		return true;
	}